

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsConflictPool.cpp
# Opt level: O1

void __thiscall
HighsConflictPool::addReconvergenceCut
          (HighsConflictPool *this,HighsDomain *domain,
          set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
          *reconvergenceFrontier,HighsDomainChange *reconvergenceDomchg)

{
  pointer puVar1;
  undefined8 *puVar2;
  _Rb_tree_color _Var3;
  int iVar4;
  _Base_ptr p_Var5;
  pointer piVar6;
  pointer ppVar7;
  int *piVar8;
  pointer pHVar9;
  pointer ppCVar10;
  _Base_ptr p_Var11;
  const_iterator __position;
  _Rb_tree_node_base *p_Var12;
  int iVar13;
  const_iterator cVar14;
  long lVar15;
  int iVar16;
  _Rb_tree_header *p_Var17;
  pointer ppCVar18;
  HighsDomainChange *pHVar19;
  ulong extraout_XMM0_Qb;
  HighsDomainChange HVar20;
  HighsInt end;
  HighsInt start;
  int local_60;
  int local_5c;
  HighsDomainChange *local_58;
  _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
  *local_48;
  ulong uStack_40;
  int local_34;
  
  iVar13 = (int)(reconvergenceFrontier->_M_t)._M_impl.super__Rb_tree_header._M_node_count + 1;
  local_58 = reconvergenceDomchg;
  if ((this->freeSpaces_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var17 = &(this->freeSpaces_)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = (this->freeSpaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    __position._M_node = &p_Var17->_M_header;
    for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = *(_Base_ptr *)((long)&p_Var5->_M_color + lVar15)) {
      if (((int)p_Var5[1]._M_color < iVar13) ||
         ((lVar15 = 0x10, cVar14._M_node = p_Var5, (int)p_Var5[1]._M_color <= iVar13 &&
          (*(int *)&p_Var5[1].field_0x4 < -1)))) {
        lVar15 = 0x18;
        cVar14._M_node = __position._M_node;
      }
      __position._M_node = cVar14._M_node;
    }
    if ((_Rb_tree_header *)__position._M_node != p_Var17) {
      local_48 = (_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                  *)&this->freeSpaces_;
      _Var3 = __position._M_node[1]._M_color;
      iVar4 = *(int *)&__position._M_node[1].field_0x4;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::erase_abi_cxx11_(local_48,__position);
      local_60 = iVar4 + iVar13;
      iVar16 = _Var3 - iVar13;
      local_5c = iVar4;
      if (iVar16 != 0 && iVar13 <= (int)_Var3) {
        local_34 = iVar16;
        std::
        _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
        ::_M_emplace_unique<int,int&>(local_48,&local_34,&local_60);
      }
      goto LAB_0027fa07;
    }
  }
  local_5c = (int)((ulong)((long)(this->conflictEntries_).
                                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->conflictEntries_).
                                super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4);
  local_60 = iVar13 + local_5c;
  std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::resize
            (&this->conflictEntries_,(long)local_60);
LAB_0027fa07:
  piVar6 = (this->deletedConflicts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->deletedConflicts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start == piVar6) {
    iVar13 = (int)((ulong)((long)(this->conflictRanges_).
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->conflictRanges_).
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               &this->conflictRanges_,&local_5c,&local_60);
    std::vector<short,_std::allocator<short>_>::resize
              (&this->ages_,
               (long)(this->conflictRanges_).
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->conflictRanges_).
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->modification_,
               (long)(this->conflictRanges_).
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->conflictRanges_).
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3);
  }
  else {
    iVar13 = piVar6[-1];
    (this->deletedConflicts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar6 + -1;
    ppVar7 = (this->conflictRanges_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar7[iVar13].first = local_5c;
    ppVar7[iVar13].second = local_60;
  }
  puVar1 = (this->modification_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start + iVar13;
  *puVar1 = *puVar1 + 1;
  (this->ages_).super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar13] = 0;
  piVar8 = (this->ageDistribution_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *piVar8 = *piVar8 + 1;
  lVar15 = (long)local_5c;
  HVar20 = HighsDomain::flip(domain,local_58);
  pHVar9 = (this->conflictEntries_).
           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar9[lVar15].boundval = HVar20.boundval;
  pHVar9 = pHVar9 + lVar15;
  pHVar9->column = (int)HVar20._8_8_;
  pHVar9->boundtype = (int)((ulong)HVar20._8_8_ >> 0x20);
  local_58 = (HighsDomainChange *)HighsDomain::feastol(domain);
  p_Var12 = (reconvergenceFrontier->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var17 = &(reconvergenceFrontier->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var12 != p_Var17) {
    local_48 = (_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                *)((ulong)local_58 ^ 0x8000000000000000);
    uStack_40 = extraout_XMM0_Qb ^ 0x8000000000000000;
    lVar15 = lVar15 * 0x10;
    do {
      p_Var11 = p_Var12[1]._M_left;
      puVar2 = (undefined8 *)
               ((long)&(this->conflictEntries_).
                       super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].boundval + lVar15);
      *puVar2 = p_Var12[1]._M_parent;
      puVar2[1] = p_Var11;
      pHVar9 = (this->conflictEntries_).
               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((domain->mipsolver->model_->integrality_).
          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start[*(int *)((long)&pHVar9[1].column + lVar15)] ==
          kContinuous) {
        pHVar19 = local_58;
        if (*(int *)((long)&pHVar9[1].boundtype + lVar15) != 0) {
          pHVar19 = (HighsDomainChange *)local_48;
        }
        *(double *)((long)&pHVar9[1].boundval + lVar15) =
             (double)pHVar19 + *(double *)((long)&pHVar9[1].boundval + lVar15);
      }
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
      lVar15 = lVar15 + 0x10;
    } while ((_Rb_tree_header *)p_Var12 != p_Var17);
  }
  ppCVar10 = (this->propagationDomains).
             super__Vector_base<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar18 = (this->propagationDomains).
                  super__Vector_base<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppCVar18 != ppCVar10;
      ppCVar18 = ppCVar18 + 1) {
    HighsDomain::ConflictPoolPropagation::conflictAdded(*ppCVar18,iVar13);
  }
  return;
}

Assistant:

void HighsConflictPool::addReconvergenceCut(
    const HighsDomain& domain,
    const std::set<HighsDomain::ConflictSet::LocalDomChg>&
        reconvergenceFrontier,
    const HighsDomainChange& reconvergenceDomchg) {
  HighsInt conflictIndex;
  HighsInt start;
  HighsInt end;
  HighsInt conflictLen = reconvergenceFrontier.size() + 1;
  std::set<std::pair<HighsInt, HighsInt>>::iterator it;
  if (freeSpaces_.empty() ||
      (it = freeSpaces_.lower_bound(
           std::make_pair(conflictLen, HighsInt{-1}))) == freeSpaces_.end()) {
    start = conflictEntries_.size();
    end = start + conflictLen;

    conflictEntries_.resize(end);
  } else {
    std::pair<HighsInt, HighsInt> freeslot = *it;
    freeSpaces_.erase(it);

    start = freeslot.second;
    end = start + conflictLen;
    // if the space was not completely occupied, we register the remainder of
    // it again in the priority queue
    if (freeslot.first > conflictLen) {
      freeSpaces_.emplace(freeslot.first - conflictLen, end);
    }
  }

  // register the range of entries for this conflict with a reused or a new
  // index
  if (deletedConflicts_.empty()) {
    conflictIndex = conflictRanges_.size();
    conflictRanges_.emplace_back(start, end);
    ages_.resize(conflictRanges_.size());
    modification_.resize(conflictRanges_.size());
  } else {
    conflictIndex = deletedConflicts_.back();
    deletedConflicts_.pop_back();
    conflictRanges_[conflictIndex].first = start;
    conflictRanges_[conflictIndex].second = end;
  }

  modification_[conflictIndex] += 1;
  ages_[conflictIndex] = 0;
  ageDistribution_[ages_[conflictIndex]] += 1;

  HighsInt i = start;
  const std::vector<HighsDomainChange>& domchgStack_ =
      domain.getDomainChangeStack();
  assert(i < end);
  conflictEntries_[i++] = domain.flip(reconvergenceDomchg);
  double feastol = domain.feastol();
  for (const HighsDomain::ConflictSet::LocalDomChg& domchg :
       reconvergenceFrontier) {
    assert(i < end);
    assert(domchg.pos >= 0);
    assert(domchg.pos < (HighsInt)domchgStack_.size());
    conflictEntries_[i] = domchg.domchg;
    if (domain.variableType(conflictEntries_[i].column) ==
        HighsVarType::kContinuous) {
      if (conflictEntries_[i].boundtype == HighsBoundType::kLower)
        conflictEntries_[i].boundval += feastol;
      else
        conflictEntries_[i].boundval -= feastol;
    }
    ++i;
  }

  for (HighsDomain::ConflictPoolPropagation* conflictProp : propagationDomains)
    conflictProp->conflictAdded(conflictIndex);
}